

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void * Abc_NtkAttrFree(Abc_Ntk_t *pNtk,int Attr,int fFreeMan)

{
  int *__ptr;
  int i;
  void *pvVar1;
  long lVar2;
  
  __ptr = (int *)Vec_PtrEntry(pNtk->vAttrs,Attr);
  pvVar1 = (void *)0x0;
  Vec_PtrWriteEntry(pNtk->vAttrs,Attr,(void *)0x0);
  if (__ptr != (int *)0x0) {
    if (*(long *)(__ptr + 10) != 0) {
      for (lVar2 = 0; lVar2 < *__ptr; lVar2 = lVar2 + 1) {
        if (*(long *)(*(long *)(__ptr + 2) + lVar2 * 8) != 0) {
          (**(code **)(__ptr + 10))(*(undefined8 *)(__ptr + 4));
        }
      }
    }
    pvVar1 = *(void **)(__ptr + 4);
    if (fFreeMan != 0) {
      if (pvVar1 != (void *)0x0) {
        (**(code **)(__ptr + 6))(pvVar1);
      }
      pvVar1 = (void *)0x0;
    }
    free(*(void **)(__ptr + 2));
    free(__ptr);
  }
  return pvVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Frees one attribute manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Abc_NtkAttrFree( Abc_Ntk_t * pNtk, int Attr, int fFreeMan ) 
{  
    void * pUserMan;
    Vec_Att_t * pAttrMan;
    pAttrMan = (Vec_Att_t *)Vec_PtrEntry( pNtk->vAttrs, Attr );
    Vec_PtrWriteEntry( pNtk->vAttrs, Attr, NULL );
    pUserMan = Vec_AttFree( pAttrMan, fFreeMan );
    return pUserMan;
}